

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 sqlite3FkOldmask(Parse *pParse,Table *pTab)

{
  long in_RSI;
  long *in_RDI;
  Index *pIdx;
  Index **in_stack_00000010;
  int i;
  FKey *p;
  Table *in_stack_00000020;
  u32 mask;
  uint local_34;
  int local_24;
  FKey *local_20;
  u32 local_14;
  
  local_14 = 0;
  if ((*(uint *)(*in_RDI + 0x2c) & 0x80000) != 0) {
    for (local_20 = *(FKey **)(in_RSI + 0x20); local_20 != (FKey *)0x0;
        local_20 = *(FKey **)((long)local_20 + 8)) {
      for (local_24 = 0; local_24 < *(int *)((long)local_20 + 0x28); local_24 = local_24 + 1) {
        if (*(int *)((long)local_20 + 0x40 + (long)local_24 * 0x10) < 0x20) {
          local_34 = 1 << ((byte)*(undefined4 *)((long)local_20 + 0x40 + (long)local_24 * 0x10) &
                          0x1f);
        }
        else {
          local_34 = 0xffffffff;
        }
        local_14 = local_34 | local_14;
      }
    }
    for (local_20 = sqlite3FkReferences((Table *)0x1a06de); local_20 != (FKey *)0x0;
        local_20 = local_20->pNextTo) {
      sqlite3FkLocateIndex((Parse *)pTab,in_stack_00000020,p,in_stack_00000010,(int **)pIdx);
    }
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3FkOldmask(
  Parse *pParse,                  /* Parse context */
  Table *pTab                     /* Table being modified */
){
  u32 mask = 0;
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *p;
    int i;
    for(p=pTab->pFKey; p; p=p->pNextFrom){
      for(i=0; i<p->nCol; i++) mask |= COLUMN_MASK(p->aCol[i].iFrom);
    }
    for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
      Index *pIdx = 0;
      sqlite3FkLocateIndex(pParse, pTab, p, &pIdx, 0);
      if( pIdx ){
        for(i=0; i<pIdx->nKeyCol; i++) mask |= COLUMN_MASK(pIdx->aiColumn[i]);
      }
    }
  }
  return mask;
}